

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall SynthWidget::on_audioRecord_clicked(SynthWidget *this)

{
  QPushButton *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  Master *this_00;
  QSettings *pQVar8;
  QString fileName;
  QArrayDataPointer<char16_t> local_80;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QVariant local_40;
  
  bVar5 = SynthRoute::isRecordingAudio(this->synthRoute);
  if (bVar5) {
    pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
    QString::QString((QString *)&local_40,"Record");
    QAbstractButton::setText((QString *)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
    SynthRoute::stopRecordingAudio(this->synthRoute);
  }
  else {
    if (on_audioRecord_clicked()::currentDir == '\0') {
      iVar7 = __cxa_guard_acquire(&on_audioRecord_clicked()::currentDir);
      if (iVar7 != 0) {
        QString::QString(&on_audioRecord_clicked::currentDir,(char *)0x0);
        __cxa_atexit(QString::~QString,&on_audioRecord_clicked::currentDir,&__dso_handle);
        __cxa_guard_release(&on_audioRecord_clicked()::currentDir);
      }
    }
    this_00 = Master::getInstance();
    pQVar8 = Master::getSettings(this_00);
    QString::QString((QString *)&local_80,"Master/qFileDialogOptions");
    QVariant::QVariant((QVariant *)&local_68,0);
    QSettings::value((QString *)&local_40,(QVariant *)pQVar8);
    uVar6 = QVariant::toInt((bool *)&local_40);
    QVariant::~QVariant(&local_40);
    QVariant::~QVariant((QVariant *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QString::QString((QString *)&local_68,(char *)0x0);
    QString::QString((QString *)&local_80,"*.wav *.raw;;*.wav;;*.raw;;*.*");
    QFileDialog::getSaveFileName
              (&local_40,this,&local_68,&on_audioRecord_clicked::currentDir,&local_80,0,uVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (local_40.d.data._16_8_ != 0) {
      QDir::QDir((QDir *)&local_80,(QString *)&local_40);
      QDir::absolutePath();
      qVar4 = on_audioRecord_clicked::currentDir.d.size;
      pcVar3 = on_audioRecord_clicked::currentDir.d.ptr;
      pDVar2 = on_audioRecord_clicked::currentDir.d.d;
      on_audioRecord_clicked::currentDir.d.d = (Data *)local_68.shared;
      on_audioRecord_clicked::currentDir.d.ptr = (char16_t *)local_68._8_8_;
      local_68.shared = (PrivateShared *)pDVar2;
      local_68._8_8_ = pcVar3;
      on_audioRecord_clicked::currentDir.d.size = local_68._16_8_;
      local_68._16_8_ = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QDir::~QDir((QDir *)&local_80);
      pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
      QString::QString((QString *)&local_68,"Stop");
      QAbstractButton::setText((QString *)pQVar1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      SynthRoute::startRecordingAudio(this->synthRoute,(QString *)&local_40);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
  }
  return;
}

Assistant:

void SynthWidget::on_audioRecord_clicked() {
	if (synthRoute->isRecordingAudio()) {
		ui->audioRecord->setText("Record");
		synthRoute->stopRecordingAudio();
	} else {
		static QString currentDir = NULL;
		QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
		QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "*.wav *.raw;;*.wav;;*.raw;;*.*",
			NULL, qFileDialogOptions);
		if (!fileName.isEmpty()) {
			currentDir = QDir(fileName).absolutePath();
			ui->audioRecord->setText("Stop");
			synthRoute->startRecordingAudio(fileName);
		}
	}
}